

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint32_t ExtraCostCombined_C(uint32_t *X,uint32_t *Y,int length)

{
  int xy1;
  int xy0;
  uint32_t cost;
  int i;
  int length_local;
  uint32_t *Y_local;
  uint32_t *X_local;
  
  cost = X[4] + Y[4] + X[5] + Y[5];
  for (i = 2; i < length / 2 + -1; i = i + 1) {
    cost = i * (X[i * 2 + 2] + Y[i * 2 + 2] + X[i * 2 + 3] + Y[i * 2 + 3]) + cost;
  }
  return cost;
}

Assistant:

static uint32_t ExtraCostCombined_C(const uint32_t* WEBP_RESTRICT X,
                                    const uint32_t* WEBP_RESTRICT Y,
                                    int length) {
  int i;
  uint32_t cost = X[4] + Y[4] + X[5] + Y[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    const int xy0 = X[2 * i + 2] + Y[2 * i + 2];
    const int xy1 = X[2 * i + 3] + Y[2 * i + 3];
    cost += i * (xy0 + xy1);
  }
  return cost;
}